

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

TokenStream * __thiscall Lexer::lex(TokenStream *__return_storage_ptr__,Lexer *this)

{
  int iVar1;
  undefined1 local_7b;
  undefined1 local_7a;
  undefined1 local_79;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  if (lex()::tokenMap == '\0') {
    iVar1 = __cxa_guard_acquire(&lex()::tokenMap);
    if (iVar1 != 0) {
      local_48 = 0x60000002b;
      uStack_40 = 0x70000002d;
      local_58 = 0x40000005b;
      uStack_50 = 0x50000005d;
      local_68 = 0x20000003c;
      uStack_60 = 0x30000003e;
      local_78 = 0x2e;
      uStack_74 = 0;
      uStack_70 = 0x2c;
      uStack_6c = 1;
      std::
      _Hashtable<char,std::pair<char_const,TokenKind>,std::allocator<std::pair<char_const,TokenKind>>,std::__detail::_Select1st,std::equal_to<char>,std::hash<char>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_Hashtable<std::pair<char_const,TokenKind>const*>
                ((_Hashtable<char,std::pair<char_const,TokenKind>,std::allocator<std::pair<char_const,TokenKind>>,std::__detail::_Select1st,std::equal_to<char>,std::hash<char>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&lex::tokenMap,&local_78,&local_38,0,&local_79,&local_7a,&local_7b);
      __cxa_atexit(std::
                   unordered_map<char,_TokenKind,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_TokenKind>_>_>
                   ::~unordered_map,&lex::tokenMap,&__dso_handle);
      __cxa_guard_release(&lex()::tokenMap);
    }
  }
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<Token_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/zsr2531[P]bfc/lexer.cpp:43:24)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<Token_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/zsr2531[P]bfc/lexer.cpp:43:24)>
             ::_M_manager;
  local_38._M_unused._M_object = this;
  TokenStream::TokenStream(__return_storage_ptr__,(function<Token_()> *)&local_38);
  std::_Function_base::~_Function_base((_Function_base *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

auto Lexer::lex() -> TokenStream {
    static std::unordered_map<char, TokenKind> tokenMap = {
        { '.', TokenKind::Dot },
        { ',', TokenKind::Comma },
        { '<', TokenKind::LeftAngledBracket },
        { '>', TokenKind::RightAngledBracket },
        { '[', TokenKind::LeftBracket },
        { ']', TokenKind::RightBracket },
        { '+', TokenKind::Plus },
        { '-', TokenKind::Minus }
    };

    return TokenStream([&]() {
        char character;
        TextSpan span = TextSpan(0, 0);
        TokenKind type;

        do {
            character = supply();
            if (character == '\0')
                return Token(TextSpan(position, position), TokenKind::EndOfFile, '\0');

            span = TextSpan(position - 1, position);
            auto search = tokenMap.find(character);
            type = search == tokenMap.end() ? TokenKind::Comment : search->second;
        } while (type == TokenKind::Comment);

        return Token(span, type, character);
    });
}